

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderLoopTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderLoopCase::ShaderLoopCase
          (ShaderLoopCase *this,Context *context,char *name,char *description,bool isVertexCase,
          ShaderEvalFunc evalFunc,LoopRequirement requirement,char *vertShaderSource,
          char *fragShaderSource)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  ShaderEvalFunc evalFunc_local;
  bool isVertexCase_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderLoopCase *this_local;
  
  testCtx = gles2::Context::getTestContext(context);
  renderCtx = gles2::Context::getRenderContext(context);
  ctxInfo = gles2::Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,description,isVertexCase,
             evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderLoopCase_03288a80;
  this->m_requirement = requirement;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,vertShaderSource);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,fragShaderSource);
  return;
}

Assistant:

ShaderLoopCase::ShaderLoopCase (Context& context, const char* name, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, LoopRequirement requirement, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
	, m_requirement		(requirement)
{
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}